

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpChunkedEntityReader::tryRead
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *__return_storage_ptr__;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr___00;
  String *__return_storage_ptr___01;
  HttpInputStreamImpl *this_01;
  HttpInputStreamImpl *this_02;
  PromiseArenaMember *pPVar1;
  char *pcVar2;
  undefined8 uVar3;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> coroutine;
  unsigned_long uVar5;
  long lVar6;
  char (*params) [28];
  unsigned_long extraout_RDX;
  void *buffer_00;
  long in_R8;
  long lVar7;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  
  coroutine._M_fr_ptr = operator_new(0x6a8);
  *(code **)coroutine._M_fr_ptr = tryRead;
  *(code **)((long)coroutine._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(void **)((long)coroutine._M_fr_ptr + 0x670) = buffer;
  _kjCondition.value = (bool *)anon_var_dwarf_ad98c1;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x7fd;
  location.columnNumber = 0x13;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da7a0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da7e8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)this_00;
  _kjCondition.value = (bool *)((long)buffer + 0x20);
  if (*(char *)((long)buffer + 0x20) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x7fe,FAILED,"clean",
               "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
               &_kjCondition,
               (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
    kj::_::Debug::Fault::fatal(&f);
  }
  *(undefined1 *)((long)buffer + 0x20) = 0;
  buffer_00 = *(void **)((long)buffer + 8);
  if (buffer_00 == (void *)0x0) {
    lVar6 = 0;
  }
  else {
    __return_storage_ptr__ =
         (PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
         ((long)coroutine._M_fr_ptr + 0x240);
    __return_storage_ptr___00 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x438)
    ;
    __return_storage_ptr___01 = (String *)((long)coroutine._M_fr_ptr + 0x638);
    this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x660);
    this_02 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x668);
    lVar7 = *(long *)((long)buffer + 0x18);
    lVar6 = 0;
    uVar5 = extraout_RDX;
    do {
      *(long *)((long)coroutine._M_fr_ptr + 0x698) = in_R8;
      *(long *)((long)coroutine._M_fr_ptr + 0x690) = lVar6;
      *(size_t *)((long)coroutine._M_fr_ptr + 0x688) = maxBytes;
      *(size_t *)((long)coroutine._M_fr_ptr + 0x680) = minBytes;
      *(unsigned_long *)((long)coroutine._M_fr_ptr + 0x678) = uVar5;
      while (lVar7 == 0) {
        HttpInputStreamImpl::readChunkHeader(this_01);
        co_await<kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>>
                  (__return_storage_ptr__,
                   (Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)this_01);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x6a0) = 0;
        bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
        if (bVar4) {
          return (PromiseBase)(PromiseBase)this;
        }
        kj::_::PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::
        await_resume((OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *)
                     ((long)coroutine._M_fr_ptr + 0x5f8),__return_storage_ptr__);
        if ((*(char *)((long)coroutine._M_fr_ptr + 0x3f0) == '\x01') &&
           (*(int *)((long)coroutine._M_fr_ptr + 0x3f8) - 1U < 2)) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
        }
        if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x260));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__)
        ;
        pPVar1 = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
        if (pPVar1 != (PromiseArenaMember *)0x0) {
          (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
          kj::_::PromiseDisposer::dispose(pPVar1);
        }
        bVar4 = ((OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *)
                ((long)coroutine._M_fr_ptr + 0x5f8))->tag == 1;
        ((DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x6a1))->value = bVar4;
        if (!bVar4) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[11]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x80a,FAILED,"nextChunkSizeOrError.is<uint64_t>()",
                     "_kjCondition,\"bad header\"",
                     (DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x6a1),
                     (char (*) [11])"bad header");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0x600);
        if (lVar7 == 0) {
          HttpEntityBodyReader::doneReading
                    (*(HttpEntityBodyReader **)((long)coroutine._M_fr_ptr + 0x670));
        }
        lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x670);
        *(long *)(lVar6 + 0x18) = lVar7;
        buffer_00 = *(void **)(lVar6 + 8);
        if (buffer_00 == (void *)0x0) {
          lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x690);
          goto LAB_003f3900;
        }
      }
      params = (char (*) [28])0x1;
      HttpInputStreamImpl::tryRead
                (this_02,buffer_00,*(size_t *)((long)coroutine._M_fr_ptr + 0x680),1);
      co_await<unsigned_long>(__return_storage_ptr___00,(Promise<unsigned_long> *)this_02);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x6a0) = 1;
      bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
      if (bVar4) {
        return (PromiseBase)(PromiseBase)this;
      }
      uVar5 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr___00);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x450) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x458));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase
                ((PromiseAwaiterBase *)__return_storage_ptr___00);
      pPVar1 = (PromiseArenaMember *)(this_02->super_HttpInputStream)._vptr_HttpInputStream;
      if (pPVar1 != (PromiseArenaMember *)0x0) {
        (this_02->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose(pPVar1);
      }
      lVar7 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x18) - uVar5;
      *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x18) = lVar7;
      if (uVar5 == 0) {
        kj::_::Debug::makeDescription<char_const(&)[28]>
                  (__return_storage_ptr___01,(Debug *)"\"premature EOF in HTTP chunk\"",
                   "premature EOF in HTTP chunk",params);
        Exception::Exception
                  ((Exception *)&_kjCondition,DISCONNECTED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x81a,__return_storage_ptr___01);
        throwRecoverableException((Exception *)&_kjCondition,0);
        Exception::~Exception((Exception *)&_kjCondition);
        pcVar2 = (__return_storage_ptr___01->content).ptr;
        if (pcVar2 != (char *)0x0) {
          uVar3 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x640);
          (__return_storage_ptr___01->content).ptr = (char *)0x0;
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x640) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x648))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x648),pcVar2,1,uVar3,uVar3,0);
        }
LAB_003f39d0:
        lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x690);
        *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x20) = 1;
        *(unsigned_long *)((long)coroutine._M_fr_ptr + 0x650) = lVar6 + uVar5;
        kj::_::Coroutine<unsigned_long>::fulfill
                  (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x650));
        goto LAB_003f3926;
      }
      maxBytes = *(ulong *)((long)coroutine._M_fr_ptr + 0x688) - uVar5;
      if (*(ulong *)((long)coroutine._M_fr_ptr + 0x688) < uVar5 || maxBytes == 0) goto LAB_003f39d0;
      minBytes = *(long *)((long)coroutine._M_fr_ptr + 0x680) + uVar5;
      in_R8 = *(long *)((long)coroutine._M_fr_ptr + 0x698) - uVar5;
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x690) + uVar5;
      buffer_00 = *(void **)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 8);
    } while (buffer_00 != (void *)0x0);
  }
LAB_003f3900:
  *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x20) = 1;
  *(long *)((long)coroutine._M_fr_ptr + 0x658) = lVar6;
  kj::_::Coroutine<unsigned_long>::fulfill
            (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x658));
LAB_003f3926:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x6a0) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (alreadyDone()) {
        clean = true;
        co_return alreadyRead;
      } else if (chunkSize == 0) {
        // Read next chunk header.
        auto nextChunkSizeOrError = co_await getInner().readChunkHeader();
        KJ_REQUIRE(nextChunkSizeOrError.is<uint64_t>(), "bad header");
        auto nextChunkSize = nextChunkSizeOrError.get<uint64_t>();
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        continue;
      } else {
        // Read current chunk.
        // We have to set minBytes to 1 here so that if we read any data at all, we update our
        // counter immediately, so that we still know where we are in case of cancellation.
        auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, chunkSize));

        chunkSize -= amount;
        if (amount == 0) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk"));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
        clean = true;
        co_return alreadyRead + amount;
      }
    }
  }